

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O1

void __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::clear(lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
        *this)

{
  bool bVar1;
  consume_operation consume;
  consume_operation local_28;
  
  local_28.m_consume_data.m_queue =
       (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
        *)0x0;
  local_28.m_consume_data.m_control = (ControlBlock *)0x0;
  local_28.m_consume_data.m_next_ptr = 0;
  bVar1 = consume_operation::start_consume_impl(&local_28,0,this);
  if (bVar1) {
    do {
      consume_operation::commit(&local_28);
      bVar1 = consume_operation::start_consume_impl(&local_28,0,this);
    } while (bVar1);
  }
  consume_operation::~consume_operation(&local_28);
  return;
}

Assistant:

void clear() noexcept
        {
            consume_operation consume;
            while (try_start_consume(consume))
            {
                consume.commit();
            }
        }